

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

int XmlUtf16Encode(int charNum,unsigned_short *buf)

{
  int iVar1;
  
  iVar1 = 0;
  if (-1 < charNum) {
    if (charNum < 0x10000) {
      *buf = (ushort)charNum;
      return 1;
    }
    if (charNum < 0x110000) {
      *buf = (short)(charNum + 0x3ff0000U >> 10) + 0xd800;
      buf[1] = (ushort)charNum & 0x3ff | 0xdc00;
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

int FASTCALL
XmlUtf16Encode(int charNum, unsigned short *buf)
{
  if (charNum < 0)
    return 0;
  if (charNum < 0x10000) {
    buf[0] = (unsigned short)charNum;
    return 1;
  }
  if (charNum < 0x110000) {
    charNum -= 0x10000;
    buf[0] = (unsigned short)((charNum >> 10) + 0xD800);
    buf[1] = (unsigned short)((charNum & 0x3FF) + 0xDC00);
    return 2;
  }
  return 0;
}